

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O2

void __thiscall
ans_reorder_fold_decode<5U>::~ans_reorder_fold_decode(ans_reorder_fold_decode<5U> *this)

{
  std::_Vector_base<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>::~_Vector_base
            (&(this->table).
              super__Vector_base<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return;
}

Assistant:

static ans_reorder_fold_decode load(const uint8_t* in_u8)
    {
        ans_reorder_fold_decode model;
        auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
        in_u8 += sizeof(uint32_t);
        uint32_t do_reorder = *in_ptr_u32++;
        size_t no_except_thres = 1 << (fidelity + 8 - 1);
        std::vector<uint32_t> most_frequent(no_except_thres);
        if (do_reorder == 1) {
            for (size_t i = 0; i < no_except_thres; i++) {
                most_frequent[i] = *in_ptr_u32++;
            }
            in_u8 += no_except_thres * sizeof(uint32_t);
        } else {
            for (size_t i = 0; i < no_except_thres; i++) {
                most_frequent[i] = i;
            }
        }

        model.nfreqs = ans_load_interp(in_u8);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            uint32_t except_bytes
                = ans_reorder_fold_exception_bytes<fidelity>(sym);
            uint32_t mapped_num
                = ans_reorder_fold_undo_mapping<fidelity>(most_frequent, sym)
                + (except_bytes << 30);
            for (uint32_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                model.table[cur_base + k].mapped_num = mapped_num;
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }